

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

int lest::run<lest::test[1]>(test (*specification) [1],ostream *os)

{
  int iVar1;
  tests tStack_28;
  
  make_tests<lest::test[1]>(&tStack_28,specification);
  iVar1 = run(&tStack_28,os);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&tStack_28);
  return iVar1;
}

Assistant:

int run(  C const & specification, std::ostream & os = std::cout )
{
    return run( make_tests( specification ), os  );
}